

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void abgr_f32_to_bgr_888(void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy
                        ,int width,int height)

{
  undefined1 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  float *pfVar6;
  undefined1 *puVar7;
  int iVar8;
  
  pfVar6 = (float *)((long)src + (long)(sy * src_pitch) + (long)sx * 0x10);
  puVar7 = (undefined1 *)((long)dst + (long)(dx * 3) + (long)(dy * dst_pitch));
  iVar8 = 0;
  if (height < 1) {
    height = 0;
  }
  for (; iVar8 != height; iVar8 = iVar8 + 1) {
    puVar1 = puVar7 + width * 3;
    for (; puVar7 < puVar1; puVar7 = puVar7 + 3) {
      fVar2 = pfVar6[2];
      fVar3 = pfVar6[1];
      fVar4 = *pfVar6;
      *puVar7 = (char)(long)(fVar4 * 255.0);
      uVar5 = (uint)(long)(fVar4 * 255.0) |
              (int)(long)(fVar3 * 255.0) << 8 | (int)(long)(fVar2 * 255.0) << 0x10;
      puVar7[1] = (char)(uVar5 >> 8);
      puVar7[2] = (char)(uVar5 >> 0x10);
      pfVar6 = pfVar6 + 4;
    }
    pfVar6 = pfVar6 + (long)width * -4 + (long)(src_pitch / 0x10) * 4;
    puVar7 = puVar7 + (dst_pitch + width * -3);
  }
  return;
}

Assistant:

static void abgr_f32_to_bgr_888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const ALLEGRO_COLOR *src_ptr = (const ALLEGRO_COLOR *)((const char *)src + sy * src_pitch);
   uint8_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 16 - width;
   int dst_gap = dst_pitch / 1 - width * 3;
   src_ptr += sx;
   dst_ptr += dx * 3;
   for (y = 0; y < height; y++) {
      uint8_t *dst_end = dst_ptr + width * 3;
      while (dst_ptr < dst_end) {
         int dst_pixel = ALLEGRO_CONVERT_ABGR_F32_TO_BGR_888(*src_ptr);
         #ifdef ALLEGRO_BIG_ENDIAN
         dst_ptr[0] = dst_pixel >> 16;
         dst_ptr[1] = dst_pixel >> 8;
         dst_ptr[2] = dst_pixel;
         #else
         dst_ptr[0] = dst_pixel;
         dst_ptr[1] = dst_pixel >> 8;
         dst_ptr[2] = dst_pixel >> 16;
         #endif
         src_ptr += 1;
         dst_ptr += 1 * 3;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}